

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_time.c
# Opt level: O1

timeval * zt_diff_time(timeval *dt,timeval *t1,timeval *t2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  dt->tv_sec = t2->tv_sec - t1->tv_sec;
  lVar1 = t2->tv_usec;
  lVar2 = t1->tv_usec;
  lVar4 = lVar1 - lVar2;
  dt->tv_usec = lVar4;
  if (lVar4 < 0) {
    lVar3 = -1000000;
    if (-1000000 < lVar4) {
      lVar3 = lVar4;
    }
    uVar5 = (ulong)(lVar3 + lVar2 != lVar1);
    uVar5 = (((lVar3 + lVar2) - lVar1) - uVar5) / 1000000 + uVar5;
    dt->tv_usec = ((uVar5 * 1000000 + lVar1) - lVar2) + 1000000;
    dt->tv_sec = dt->tv_sec + ~uVar5;
  }
  return dt;
}

Assistant:

struct timeval *
zt_diff_time(struct timeval *dt, struct timeval *t1, struct timeval *t2)
{
    dt->tv_sec = t2->tv_sec - t1->tv_sec;
    dt->tv_usec = t2->tv_usec - t1->tv_usec;

    while (dt->tv_usec < 0) {
        dt->tv_usec += 1000000;
        dt->tv_sec -= 1;
    }
    return dt;
}